

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10310e3::
BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
::Common(BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
         *this,int block_size)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  long *in_RDI;
  AssertionResult gtest_ar;
  int c;
  int r;
  uchar *p_src1;
  uchar *p_src0;
  int in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 uVar3;
  int line;
  long *file;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar4;
  AssertionResult local_58;
  int local_44;
  int local_40;
  Message *in_stack_ffffffffffffffd8;
  AssertHelper *in_stack_ffffffffffffffe0;
  AssertHelper *this_01;
  long *local_18;
  
  *(uint *)(in_RDI + 0xa02a) = (uint)::block_size_wide[in_ESI];
  *(uint *)((long)in_RDI + 0x50154) = (uint)::block_size_high[in_ESI];
  file = in_RDI + 3;
  uVar3 = 0x21;
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *(int *)((long)in_RDI + 0x2803c) = iVar2;
  line = 0x281;
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *(int *)(in_RDI + 0x5007) = iVar2 + (int)in_RDI[0xa02a];
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *(int *)((long)in_RDI + 0x3c044) = iVar2;
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *(int *)(in_RDI + 0x7808) = iVar2 + (int)in_RDI[0xa02a];
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *(int *)((long)in_RDI + 0x5004c) = iVar2;
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *(int *)(in_RDI + 0xa009) = iVar2 + (int)in_RDI[0xa02a];
  iVar2 = libaom_test::ACMRandom::operator()
                    ((ACMRandom *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  if (iVar2 == 0) {
    local_18 = in_RDI + 0x5008;
    this_01 = (AssertHelper *)(in_RDI + 0x7809);
  }
  else if (iVar2 == 1) {
    local_18 = in_RDI + 0x2807;
    *(int *)(in_RDI + 0x7808) = (int)in_RDI[0x5007];
    *(undefined4 *)((long)in_RDI + 0x3c044) = *(undefined4 *)((long)in_RDI + 0x2803c);
    this_01 = (AssertHelper *)(in_RDI + 0x7809);
  }
  else {
    if (iVar2 != 2) {
      testing::Message::Message((Message *)CONCAT44(in_stack_ffffffffffffff94,iVar2));
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff94,iVar2),
                 (Type)((ulong)in_RDI >> 0x20),(char *)file,line,
                 (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff60);
      testing::Message::~Message((Message *)0xa78157);
      return;
    }
    local_18 = in_RDI + 0x5008;
    this_01 = (AssertHelper *)(in_RDI + 0x2807);
    *(int *)(in_RDI + 0xa009) = (int)in_RDI[0x5007];
    *(undefined4 *)((long)in_RDI + 0x5004c) = *(undefined4 *)((long)in_RDI + 0x2803c);
  }
  (**(code **)(*in_RDI + 0x30))(in_RDI,local_18,this_01);
  local_40 = 0;
  do {
    if (*(int *)((long)in_RDI + 0x50154) <= local_40) {
      return;
    }
    for (local_44 = 0; local_44 < (int)in_RDI[0xa02a]; local_44 = local_44 + 1) {
      this_00 = &local_58;
      testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                ((char *)CONCAT44(line,uVar3),
                 (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 &this_00->success_,(uchar *)in_stack_ffffffffffffff60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
      in_stack_ffffffffffffff77 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT44(in_stack_ffffffffffffff94,iVar2));
        in_stack_ffffffffffffff60 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xa7827f);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff94,iVar2),
                   (Type)((ulong)in_RDI >> 0x20),(char *)file,line,
                   (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
        testing::internal::AssertHelper::operator=(this_01,in_stack_ffffffffffffffd8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff60);
        testing::Message::~Message((Message *)0xa782cd);
      }
      uVar4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xa7831d);
      if (uVar4 != 0) {
        return;
      }
      in_stack_ffffffffffffff94 = 0;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void Common(int block_size) {
    w_ = block_size_wide[block_size];
    h_ = block_size_high[block_size];

    dst_offset_ = this->rng_(33);
    dst_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    src0_offset_ = this->rng_(33);
    src0_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    src1_offset_ = this->rng_(33);
    src1_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    T *p_src0;
    T *p_src1;

    switch (this->rng_(3)) {
      case 0:  // Separate sources
        p_src0 = src0_;
        p_src1 = src1_;
        break;
      case 1:  // src0 == dst
        p_src0 = dst_tst_;
        src0_stride_ = dst_stride_;
        src0_offset_ = dst_offset_;
        p_src1 = src1_;
        break;
      case 2:  // src1 == dst
        p_src0 = src0_;
        p_src1 = dst_tst_;
        src1_stride_ = dst_stride_;
        src1_offset_ = dst_offset_;
        break;
      default: FAIL();
    }

    Execute(p_src0, p_src1);

    for (int r = 0; r < h_; ++r) {
      for (int c = 0; c < w_; ++c) {
        ASSERT_EQ(dst_ref_[dst_offset_ + r * dst_stride_ + c],
                  dst_tst_[dst_offset_ + r * dst_stride_ + c]);
      }
    }
  }